

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateVariableAccess(ExpressionTranslateContext *ctx,ExprVariableAccess *expression)

{
  VariableData *variable;
  
  variable = expression->variable;
  if (variable->type != ctx->ctx->typeVoid) {
    if (variable->scope == ctx->ctx->globalScope) {
      Print(ctx,"::");
      variable = expression->variable;
    }
    TranslateVariableName(ctx,variable);
    return;
  }
  Print(ctx,"void()");
  return;
}

Assistant:

void TranslateVariableAccess(ExpressionTranslateContext &ctx, ExprVariableAccess *expression)
{
	if(expression->variable->type == ctx.ctx.typeVoid)
	{
		Print(ctx, "void()");
		return;
	}

	if(expression->variable->scope == ctx.ctx.globalScope)
		Print(ctx, "::");

	TranslateVariableName(ctx, expression->variable);
}